

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int x25519_decap(EVP_HPKE_KEY *key,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
                uint8_t *enc,size_t enc_len)

{
  uint16_t kem_id;
  int iVar1;
  EVP_MD *hkdf_md;
  uint8_t dh [32];
  uint8_t kem_context [64];
  size_t in_stack_ffffffffffffff70;
  uint8_t local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((enc_len == 0x20) && (iVar1 = X25519(local_88,key->private_key,enc), iVar1 != 0)) {
    local_68 = *(undefined8 *)enc;
    uStack_60 = *(undefined8 *)(enc + 8);
    local_58 = *(undefined8 *)(enc + 0x10);
    uStack_50 = *(undefined8 *)(enc + 0x18);
    local_48 = *(undefined8 *)key->public_key;
    uStack_40 = *(undefined8 *)(key->public_key + 8);
    local_38 = *(undefined8 *)(key->public_key + 0x10);
    uStack_30 = *(undefined8 *)(key->public_key + 0x18);
    kem_id = key->kem->id;
    hkdf_md = EVP_sha256();
    iVar1 = dhkem_extract_and_expand
                      (kem_id,(EVP_MD *)hkdf_md,out_shared_secret,(size_t)local_88,(uint8_t *)0x20,
                       (size_t)&local_68,(uint8_t *)0x40,in_stack_ffffffffffffff70);
    if (iVar1 != 0) {
      *out_shared_secret_len = 0x20;
      return 1;
    }
    return 0;
  }
  ERR_put_error(6,0,0x86,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,0xd3);
  return 0;
}

Assistant:

static int x25519_decap(const EVP_HPKE_KEY *key, uint8_t *out_shared_secret,
                        size_t *out_shared_secret_len, const uint8_t *enc,
                        size_t enc_len) {
  uint8_t dh[X25519_SHARED_KEY_LEN];
  if (enc_len != X25519_PUBLIC_VALUE_LEN ||
      !X25519(dh, key->private_key, enc)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[2 * X25519_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, enc, X25519_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + X25519_PUBLIC_VALUE_LEN, key->public_key,
                 X25519_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(key->kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}